

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_logger.h
# Opt level: O0

void __thiscall leveldb::PosixLogger::Logv(PosixLogger *this,char *format,__va_list_tag *arguments)

{
  id __id;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  size_t __maxlen;
  undefined8 uVar9;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  va_list arguments_copy;
  int buffer_offset;
  char *buffer;
  int buffer_size;
  int iteration;
  int dynamic_buffer_size;
  char stack_buffer [512];
  int kStackBufferSize;
  string thread_id;
  ostringstream thread_stream;
  int kMaxThreadIdSize;
  tm now_components;
  time_t now_seconds;
  timeval now_timeval;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  char *local_480;
  int local_474;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  int local_444;
  char *local_440;
  int local_434;
  uint local_430;
  int local_42c;
  char local_428 [516];
  undefined4 local_224;
  string local_220 [32];
  native_handle_type local_200;
  ostringstream local_1f8 [380];
  undefined4 local_7c;
  tm local_78;
  __time_t local_40;
  timeval local_38;
  undefined8 *local_28;
  char *local_20;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  local_40 = local_38.tv_sec;
  localtime_r(&local_40,&local_78);
  local_7c = 0x20;
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  local_200 = (native_handle_type)std::this_thread::get_id();
  __id._M_thread._4_4_ = in_stack_fffffffffffffb3c;
  __id._M_thread._0_4_ = in_stack_fffffffffffffb38;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                  CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),__id);
  std::__cxx11::ostringstream::str();
  uVar8 = std::__cxx11::string::size();
  if (0x20 < uVar8) {
    std::__cxx11::string::resize((ulong)local_220);
  }
  local_224 = 0x200;
  local_42c = 0;
  local_430 = 0;
  do {
    if (1 < local_430) {
LAB_001180fb:
      std::__cxx11::string::~string(local_220);
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
      return;
    }
    if (local_430 == 0) {
      local_474 = 0x200;
    }
    else {
      local_474 = local_42c;
    }
    local_434 = local_474;
    if (local_430 == 0) {
      local_480 = local_428;
    }
    else {
      local_480 = (char *)operator_new__((long)local_42c);
    }
    iVar3 = local_78.tm_mday;
    iVar2 = local_78.tm_hour;
    iVar1 = local_78.tm_min;
    iVar7 = local_78.tm_sec;
    local_440 = local_480;
    __maxlen = (size_t)local_434;
    uVar4 = local_78.tm_year + 0x76c;
    uVar5 = local_78.tm_mon + 1;
    uVar6 = (undefined4)local_38.tv_usec;
    uVar9 = std::__cxx11::string::c_str();
    local_444 = snprintf(local_480,__maxlen,"%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",(ulong)uVar4,
                         (ulong)uVar5,(ulong)(uint)iVar3,iVar2,iVar1,iVar7,uVar6,uVar9);
    local_458 = local_28[2];
    local_468 = *local_28;
    uStack_460 = local_28[1];
    iVar7 = vsnprintf(local_440 + local_444,(long)(local_434 - local_444),local_20,&local_468);
    local_444 = iVar7 + local_444;
    if (local_444 < local_434 + -1) {
LAB_00118046:
      if (local_440[local_444 + -1] != '\n') {
        local_440[local_444] = '\n';
        local_444 = local_444 + 1;
      }
      fwrite(local_440,1,(long)local_444,*(FILE **)(in_RDI + 8));
      fflush(*(FILE **)(in_RDI + 8));
      if ((local_430 != 0) && (local_440 != (char *)0x0)) {
        operator_delete__(local_440);
      }
      goto LAB_001180fb;
    }
    if (local_430 != 0) {
      local_444 = local_434 + -1;
      goto LAB_00118046;
    }
    local_42c = local_444 + 2;
    local_430 = 1;
  } while( true );
}

Assistant:

void Logv(const char* format, va_list arguments) override {
    // Record the time as close to the Logv() call as possible.
    struct ::timeval now_timeval;
    ::gettimeofday(&now_timeval, nullptr);
    const std::time_t now_seconds = now_timeval.tv_sec;
    struct std::tm now_components;
    ::localtime_r(&now_seconds, &now_components);

    // Record the thread ID.
    constexpr const int kMaxThreadIdSize = 32;
    std::ostringstream thread_stream;
    thread_stream << std::this_thread::get_id();
    std::string thread_id = thread_stream.str();
    if (thread_id.size() > kMaxThreadIdSize) {
      thread_id.resize(kMaxThreadIdSize);
    }

    // We first attempt to print into a stack-allocated buffer. If this attempt
    // fails, we make a second attempt with a dynamically allocated buffer.
    constexpr const int kStackBufferSize = 512;
    char stack_buffer[kStackBufferSize];
    static_assert(sizeof(stack_buffer) == static_cast<size_t>(kStackBufferSize),
                  "sizeof(char) is expected to be 1 in C++");

    int dynamic_buffer_size = 0;  // Computed in the first iteration.
    for (int iteration = 0; iteration < 2; ++iteration) {
      const int buffer_size =
          (iteration == 0) ? kStackBufferSize : dynamic_buffer_size;
      char* const buffer =
          (iteration == 0) ? stack_buffer : new char[dynamic_buffer_size];

      // Print the header into the buffer.
      int buffer_offset = snprintf(
          buffer, buffer_size, "%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",
          now_components.tm_year + 1900, now_components.tm_mon + 1,
          now_components.tm_mday, now_components.tm_hour, now_components.tm_min,
          now_components.tm_sec, static_cast<int>(now_timeval.tv_usec),
          thread_id.c_str());

      // The header can be at most 28 characters (10 date + 15 time +
      // 3 delimiters) plus the thread ID, which should fit comfortably into the
      // static buffer.
      assert(buffer_offset <= 28 + kMaxThreadIdSize);
      static_assert(28 + kMaxThreadIdSize < kStackBufferSize,
                    "stack-allocated buffer may not fit the message header");
      assert(buffer_offset < buffer_size);

      // Print the message into the buffer.
      std::va_list arguments_copy;
      va_copy(arguments_copy, arguments);
      buffer_offset +=
          std::vsnprintf(buffer + buffer_offset, buffer_size - buffer_offset,
                         format, arguments_copy);
      va_end(arguments_copy);

      // The code below may append a newline at the end of the buffer, which
      // requires an extra character.
      if (buffer_offset >= buffer_size - 1) {
        // The message did not fit into the buffer.
        if (iteration == 0) {
          // Re-run the loop and use a dynamically-allocated buffer. The buffer
          // will be large enough for the log message, an extra newline and a
          // null terminator.
          dynamic_buffer_size = buffer_offset + 2;
          continue;
        }

        // The dynamically-allocated buffer was incorrectly sized. This should
        // not happen, assuming a correct implementation of (v)snprintf. Fail
        // in tests, recover by truncating the log message in production.
        assert(false);
        buffer_offset = buffer_size - 1;
      }

      // Add a newline if necessary.
      if (buffer[buffer_offset - 1] != '\n') {
        buffer[buffer_offset] = '\n';
        ++buffer_offset;
      }

      assert(buffer_offset <= buffer_size);
      std::fwrite(buffer, 1, buffer_offset, fp_);
      std::fflush(fp_);

      if (iteration != 0) {
        delete[] buffer;
      }
      break;
    }
  }